

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ssize_t __thiscall smf::MidiFile::read(MidiFile *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  ssize_t sVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  void *pvVar11;
  reference ppMVar12;
  MidiEventList *pMVar13;
  reference pvVar14;
  void *__buf_00;
  undefined4 in_register_00000034;
  int local_27c;
  int local_278;
  int absticks;
  int i;
  int xstatus;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  MidiEvent event;
  int iStack_214;
  uchar runningCommand;
  int subframes;
  int framespersecond;
  int z;
  int tracks;
  int type;
  ushort shortdata;
  ulong longdata;
  int character;
  string filename;
  undefined1 local_1bc [8];
  Binasc binasc;
  stringstream binarydata;
  ostream local_198 [376];
  istream *local_20;
  istream *input_local;
  MidiFile *this_local;
  
  local_20 = (istream *)CONCAT44(in_register_00000034,__fd);
  this->m_rwstatus = true;
  input_local = (istream *)this;
  iVar4 = std::istream::peek();
  if (iVar4 != 0x4d) {
    std::__cxx11::stringstream::stringstream((stringstream *)&binasc.m_maxLineLength);
    Binasc::Binasc((Binasc *)local_1bc);
    Binasc::writeToBinary((Binasc *)local_1bc,local_198,local_20);
    std::istream::seekg((long)&binasc.m_maxLineLength,_S_beg);
    iVar4 = std::istream::peek();
    if (iVar4 == 0x4d) {
      sVar7 = read(this,(int)&binasc + 0xc,__buf_00,__nbytes);
      this->m_rwstatus = (bool)((byte)sVar7 & 1);
      bVar2 = this->m_rwstatus;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Bad MIDI data input");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this->m_rwstatus = false;
      bVar2 = this->m_rwstatus;
    }
    this_local._7_1_ = bVar2 & 1;
    Binasc::~Binasc((Binasc *)local_1bc);
    uVar8 = std::__cxx11::stringstream::~stringstream((stringstream *)&binasc.m_maxLineLength);
    goto LAB_00131a63;
  }
  pcVar9 = getFilename(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&character,pcVar9,(allocator *)((long)&longdata + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&longdata + 7));
  longdata._0_4_ = std::istream::get();
  if ((int)longdata == -1) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"In file ");
    poVar6 = std::operator<<(poVar6,(string *)&character);
    poVar6 = std::operator<<(poVar6,": unexpected end of file.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Expecting \'M\' at first byte, but found nothing.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this->m_rwstatus = false;
    this_local._7_1_ = this->m_rwstatus & 1;
  }
  else if ((int)longdata == 0x4d) {
    longdata._0_4_ = std::istream::get();
    if ((int)longdata == -1) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"In file ");
      poVar6 = std::operator<<(poVar6,(string *)&character);
      poVar6 = std::operator<<(poVar6,": unexpected end of file.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "Expecting \'T\' at second byte, but found nothing.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this->m_rwstatus = false;
      this_local._7_1_ = this->m_rwstatus & 1;
    }
    else if ((int)longdata == 0x54) {
      longdata._0_4_ = std::istream::get();
      if ((int)longdata == -1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"In file ");
        poVar6 = std::operator<<(poVar6,(string *)&character);
        poVar6 = std::operator<<(poVar6,": unexpected end of file.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "Expecting \'h\' at third byte, but found nothing.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this->m_rwstatus = false;
        this_local._7_1_ = this->m_rwstatus & 1;
      }
      else if ((int)longdata == 0x68) {
        longdata._0_4_ = std::istream::get();
        if ((int)longdata == -1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"In file ");
          poVar6 = std::operator<<(poVar6,(string *)&character);
          poVar6 = std::operator<<(poVar6,": unexpected end of file.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'d\' at fourth byte, but found nothing.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          this->m_rwstatus = false;
          this_local._7_1_ = this->m_rwstatus & 1;
        }
        else if ((int)longdata == 100) {
          uVar10 = readLittleEndian4Bytes(local_20);
          if (uVar10 == 6) {
            uVar3 = readLittleEndian2Bytes(local_20);
            if (uVar3 == 0) {
              bVar1 = false;
            }
            else {
              if (uVar3 != 1) {
                poVar6 = std::operator<<((ostream *)&std::cerr,"Error: cannot handle a type-");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
                poVar6 = std::operator<<(poVar6," MIDI file");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                this->m_rwstatus = false;
                this_local._7_1_ = this->m_rwstatus & 1;
                goto LAB_00131a47;
              }
              bVar1 = true;
            }
            uVar3 = readLittleEndian2Bytes(local_20);
            if ((bVar1) || (uVar3 == 1)) {
              uVar5 = (uint)uVar3;
              clear(this);
              ppMVar12 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                         operator[](&this->m_events,0);
              if (*ppMVar12 != (value_type)0x0) {
                ppMVar12 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,0);
                pMVar13 = *ppMVar12;
                if (pMVar13 != (MidiEventList *)0x0) {
                  MidiEventList::~MidiEventList(pMVar13);
                  operator_delete(pMVar13);
                }
              }
              std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                        (&this->m_events,(long)(int)uVar5);
              for (subframes = 0; subframes < (int)uVar5; subframes = subframes + 1) {
                pMVar13 = (MidiEventList *)operator_new(0x18);
                MidiEventList::MidiEventList(pMVar13);
                ppMVar12 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)subframes);
                *ppMVar12 = pMVar13;
                ppMVar12 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)subframes);
                MidiEventList::reserve(*ppMVar12,10000);
                ppMVar12 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)subframes);
                MidiEventList::clear(*ppMVar12);
              }
              uVar3 = readLittleEndian2Bytes(local_20);
              if (uVar3 < 0x8000) {
                this->m_ticksPerQuarterNote = (uint)uVar3;
              }
              else {
                tracks._3_1_ = (byte)(uVar3 >> 8);
                iStack_214 = -(uint)tracks._3_1_ + 0x100;
                tracks._2_1_ = (byte)uVar3;
                switch(-(uint)tracks._3_1_) {
                case 0xffffff18:
                  iStack_214 = 0x18;
                  break;
                case 0xffffff19:
                  iStack_214 = 0x19;
                  break;
                default:
                  poVar6 = std::operator<<((ostream *)&std::cerr,"Warning: unknown FPS: ");
                  pvVar11 = (void *)std::ostream::operator<<(poVar6,iStack_214);
                  std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,"Using non-standard FPS: ");
                  pvVar11 = (void *)std::ostream::operator<<(poVar6,iStack_214);
                  std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
                  break;
                case 0xffffff1d:
                  iStack_214 = 0x1d;
                  break;
                case 0xffffff1e:
                  iStack_214 = 0x1e;
                }
                this->m_ticksPerQuarterNote = iStack_214 * (uint)tracks._2_1_;
              }
              MidiEvent::MidiEvent
                        ((MidiEvent *)
                         &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
              for (local_278 = 0; local_278 < (int)uVar5; local_278 = local_278 + 1) {
                event.m_eventlink._7_1_ = 0;
                longdata._0_4_ = std::istream::get();
                if ((int)longdata == -1) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"In file ");
                  poVar6 = std::operator<<(poVar6,(string *)&character);
                  poVar6 = std::operator<<(poVar6,": unexpected end of file.");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'M\' at first byte in track, but found nothing."
                                          );
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = this->m_rwstatus & 1;
                  goto LAB_00131a2f;
                }
                if ((int)longdata != 0x4d) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
                  poVar6 = std::operator<<(poVar6,(string *)&character);
                  poVar6 = std::operator<<(poVar6," is not a MIDI file");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'M\' at first byte in track but got \'");
                  poVar6 = std::operator<<(poVar6,(char)longdata);
                  poVar6 = std::operator<<(poVar6,"\'");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = this->m_rwstatus & 1;
                  goto LAB_00131a2f;
                }
                longdata._0_4_ = std::istream::get();
                if ((int)longdata == -1) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"In file ");
                  poVar6 = std::operator<<(poVar6,(string *)&character);
                  poVar6 = std::operator<<(poVar6,": unexpected end of file.");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'T\' at second byte in track, but found nothing."
                                          );
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = this->m_rwstatus & 1;
                  goto LAB_00131a2f;
                }
                if ((int)longdata != 0x54) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
                  poVar6 = std::operator<<(poVar6,(string *)&character);
                  poVar6 = std::operator<<(poVar6," is not a MIDI file");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'T\' at second byte in track but got \'");
                  poVar6 = std::operator<<(poVar6,(char)longdata);
                  poVar6 = std::operator<<(poVar6,"\'");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = this->m_rwstatus & 1;
                  goto LAB_00131a2f;
                }
                longdata._0_4_ = std::istream::get();
                if ((int)longdata == -1) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"In file ");
                  poVar6 = std::operator<<(poVar6,(string *)&character);
                  poVar6 = std::operator<<(poVar6,": unexpected end of file.");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'r\' at third byte in track, but found nothing."
                                          );
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = this->m_rwstatus & 1;
                  goto LAB_00131a2f;
                }
                if ((int)longdata != 0x72) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
                  poVar6 = std::operator<<(poVar6,(string *)&character);
                  poVar6 = std::operator<<(poVar6," is not a MIDI file");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'r\' at third byte in track but got \'");
                  poVar6 = std::operator<<(poVar6,(char)longdata);
                  poVar6 = std::operator<<(poVar6,"\'");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = this->m_rwstatus & 1;
                  goto LAB_00131a2f;
                }
                longdata._0_4_ = std::istream::get();
                if ((int)longdata == -1) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"In file ");
                  poVar6 = std::operator<<(poVar6,(string *)&character);
                  poVar6 = std::operator<<(poVar6,": unexpected end of file.");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'k\' at fourth byte in track, but found nothing."
                                          );
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = this->m_rwstatus & 1;
                  goto LAB_00131a2f;
                }
                if ((int)longdata != 0x6b) {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
                  poVar6 = std::operator<<(poVar6,(string *)&character);
                  poVar6 = std::operator<<(poVar6," is not a MIDI file");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'k\' at fourth byte in track but got \'");
                  poVar6 = std::operator<<(poVar6,(char)longdata);
                  poVar6 = std::operator<<(poVar6,"\'");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = this->m_rwstatus & 1;
                  goto LAB_00131a2f;
                }
                uVar10 = readLittleEndian4Bytes(local_20);
                ppMVar12 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)local_278);
                type = (int)uVar10;
                MidiEventList::reserve(*ppMVar12,type / 2);
                ppMVar12 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)local_278);
                MidiEventList::clear(*ppMVar12);
                local_27c = 0;
                while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
                  uVar10 = readVLValue(this,local_20);
                  type = (int)uVar10;
                  local_27c = local_27c + type;
                  iVar4 = extractMidiData(this,local_20,
                                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &i,(uchar *)((long)&event.m_eventlink + 7));
                  if (iVar4 == 0) {
                    this->m_rwstatus = false;
                    this_local._7_1_ = this->m_rwstatus & 1;
                    goto LAB_00131a2f;
                  }
                  MidiMessage::setMessage
                            ((MidiMessage *)
                             &bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
                  pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,0
                                      );
                  if (((*pvVar14 != 0xff) ||
                      ((((pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&i,1), *pvVar14 != '\x01' &&
                         (pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&i,1), *pvVar14 != '\x02')) &&
                        (pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                   operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&i,1), *pvVar14 != '\x03')) &&
                       (pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&i,1), *pvVar14 != '\x04')))) &&
                     ((pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                 operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&i,0), *pvVar14 == 0xff &&
                      (pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                 operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&i,1), *pvVar14 == '/')))) {
                    event.super_MidiMessage.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = local_278;
                    event.super_MidiMessage.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = local_27c;
                    ppMVar12 = std::
                               vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                               operator[](&this->m_events,(long)local_278);
                    MidiEventList::push_back
                              (*ppMVar12,
                               (MidiEvent *)
                               &bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                    break;
                  }
                  pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,0
                                      );
                  if ((*pvVar14 == 0xff) ||
                     (pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &i,0), *pvVar14 == 0xf0)) {
                    event.super_MidiMessage.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = local_278;
                    event.super_MidiMessage.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = local_27c;
                    ppMVar12 = std::
                               vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                               operator[](&this->m_events,(long)local_278);
                    MidiEventList::push_back
                              (*ppMVar12,
                               (MidiEvent *)
                               &bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  else {
                    event.super_MidiMessage.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ = local_278;
                    event.super_MidiMessage.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = local_27c;
                    ppMVar12 = std::
                               vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                               operator[](&this->m_events,(long)local_278);
                    MidiEventList::push_back
                              (*ppMVar12,
                               (MidiEvent *)
                               &bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                }
              }
              this->m_theTimeState = 1;
              markSequence(this);
              this_local._7_1_ = this->m_rwstatus & 1;
LAB_00131a2f:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
              MidiEvent::~MidiEvent
                        ((MidiEvent *)
                         &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cerr,
                                       "Error: Type 0 MIDI file can only contain one track");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              poVar6 = std::operator<<((ostream *)&std::cerr,"Instead track count is: ");
              pvVar11 = (void *)std::ostream::operator<<(poVar6,uVar3);
              std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
              this->m_rwstatus = false;
              this_local._7_1_ = this->m_rwstatus & 1;
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
            poVar6 = std::operator<<(poVar6,(string *)&character);
            poVar6 = std::operator<<(poVar6," is not a MIDI 1.0 Standard MIDI file.");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<((ostream *)&std::cerr,"The header size is ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar10);
            poVar6 = std::operator<<(poVar6," bytes.");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            this->m_rwstatus = false;
            this_local._7_1_ = this->m_rwstatus & 1;
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
          poVar6 = std::operator<<(poVar6,(string *)&character);
          poVar6 = std::operator<<(poVar6," is not a MIDI file");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<((ostream *)&std::cerr,"Expecting \'d\' at fourth byte but got \'"
                                  );
          poVar6 = std::operator<<(poVar6,(char)longdata);
          poVar6 = std::operator<<(poVar6,"\'");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          this->m_rwstatus = false;
          this_local._7_1_ = this->m_rwstatus & 1;
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
        poVar6 = std::operator<<(poVar6,(string *)&character);
        poVar6 = std::operator<<(poVar6," is not a MIDI file");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<((ostream *)&std::cerr,"Expecting \'h\' at third byte but got \'");
        poVar6 = std::operator<<(poVar6,(char)longdata);
        poVar6 = std::operator<<(poVar6,"\'");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this->m_rwstatus = false;
        this_local._7_1_ = this->m_rwstatus & 1;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar6 = std::operator<<(poVar6,(string *)&character);
      poVar6 = std::operator<<(poVar6," is not a MIDI file");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cerr,"Expecting \'T\' at second byte but got \'");
      poVar6 = std::operator<<(poVar6,(char)longdata);
      poVar6 = std::operator<<(poVar6,"\'");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this->m_rwstatus = false;
      this_local._7_1_ = this->m_rwstatus & 1;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"File ");
    poVar6 = std::operator<<(poVar6,(string *)&character);
    poVar6 = std::operator<<(poVar6," is not a MIDI file");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cerr,"Expecting \'M\' at first byte but got \'");
    poVar6 = std::operator<<(poVar6,(char)longdata);
    poVar6 = std::operator<<(poVar6,"\'");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this->m_rwstatus = false;
    this_local._7_1_ = this->m_rwstatus & 1;
  }
LAB_00131a47:
  uVar8 = std::__cxx11::string::~string((string *)&character);
LAB_00131a63:
  return CONCAT71((int7)((ulong)uVar8 >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

bool MidiFile::read(std::istream& input) {
	m_rwstatus = true;
	if (input.peek() != 'M') {
		// If the first byte in the input stream is not 'M', then presume that
		// the MIDI file is in the binasc format which is an ASCII representation
		// of the MIDI file.  Convert the binasc content into binary content and
		// then continue reading with this function.
		std::stringstream binarydata;
		Binasc binasc;
		binasc.writeToBinary(binarydata, input);
		binarydata.seekg(0, std::ios_base::beg);
		if (binarydata.peek() != 'M') {
			std::cerr << "Bad MIDI data input" << std::endl;
			m_rwstatus = false;
			return m_rwstatus;
		} else {
			m_rwstatus = read(binarydata);
			return m_rwstatus;
		}
	}

	std::string filename = getFilename();

	int    character;
	// uchar  buffer[123456] = {0};
	ulong  longdata;
	ushort shortdata;


	// Read the MIDI header (4 bytes of ID, 4 byte data size,
	// anticipated 6 bytes of data.

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'M' at first byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'M') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'M' at first byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'T' at second byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'T') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'T' at second byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'h' at third byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'h') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'h' at third byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'd' at fourth byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'd') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'd' at fourth byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// read header size (allow larger header size?)
	longdata = readLittleEndian4Bytes(input);
	if (longdata != 6) {
		std::cerr << "File " << filename
		     << " is not a MIDI 1.0 Standard MIDI file." << std::endl;
		std::cerr << "The header size is " << longdata << " bytes." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #1: format type
	int type;
	shortdata = readLittleEndian2Bytes(input);
	switch (shortdata) {
		case 0:
			type = 0;
			break;
		case 1:
			type = 1;
			break;
		case 2:
			// Type-2 MIDI files should probably be allowed as well,
			// but I have never seen one in the wild to test with.
		default:
			std::cerr << "Error: cannot handle a type-" << shortdata
			     << " MIDI file" << std::endl;
			m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #2: track count
	int tracks;
	shortdata = readLittleEndian2Bytes(input);
	if (type == 0 && shortdata != 1) {
		std::cerr << "Error: Type 0 MIDI file can only contain one track" << std::endl;
		std::cerr << "Instead track count is: " << shortdata << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else {
		tracks = shortdata;
	}
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
	}
	m_events.resize(tracks);
	for (int z=0; z<tracks; z++) {
		m_events[z] = new MidiEventList;
		m_events[z]->reserve(10000);   // Initialize with 10,000 event storage.
		m_events[z]->clear();
	}

	// Header parameter #3: Ticks per quarter note
	shortdata = readLittleEndian2Bytes(input);
	if (shortdata >= 0x8000) {
		int framespersecond = 255 - ((shortdata >> 8) & 0x00ff) + 1;
		int subframes       = shortdata & 0x00ff;
		switch (framespersecond) {
			case 25:  framespersecond = 25; break;
			case 24:  framespersecond = 24; break;
			case 29:  framespersecond = 29; break;  // really 29.97 for color television
			case 30:  framespersecond = 30; break;
			default:
					std::cerr << "Warning: unknown FPS: " << framespersecond << std::endl;
					std::cerr << "Using non-standard FPS: " << framespersecond << std::endl;
		}
		m_ticksPerQuarterNote = framespersecond * subframes;

		// std::cerr << "SMPTE ticks: " << m_ticksPerQuarterNote << " ticks/sec" << std::endl;
		// std::cerr << "SMPTE frames per second: " << framespersecond << std::endl;
		// std::cerr << "SMPTE subframes per frame: " << subframes << std::endl;
	}  else {
		m_ticksPerQuarterNote = shortdata;
	}


	//////////////////////////////////////////////////
	//
	// now read individual tracks:
	//

	uchar runningCommand;
	MidiEvent event;
	std::vector<uchar> bytes;
	int xstatus;
	// int barline;

	for (int i=0; i<tracks; i++) {
		runningCommand = 0;

		// std::cout << "\nReading Track: " << i + 1 << flush;

		// read track header...

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'M' at first byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'M') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'M' at first byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'T' at second byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'T') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'T' at second byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'r' at third byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'r') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'r' at third byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'k') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		// Now read track chunk size and throw it away because it is
		// not really necessary since the track MUST end with an
		// end of track meta event, and many MIDI files found in the wild
		// do not correctly give the track size.
		longdata = readLittleEndian4Bytes(input);

		// set the size of the track allocation so that it might
		// approximately fit the data.
		m_events[i]->reserve((int)longdata/2);
		m_events[i]->clear();

		// process the track
		int absticks = 0;
		// barline = 1;
		while (!input.eof()) {
			longdata = readVLValue(input);
			//std::cout << "ticks = " << longdata << std::endl;
			absticks += longdata;
			xstatus = extractMidiData(input, bytes, runningCommand);
			if (xstatus == 0) {
				m_rwstatus = false;  return m_rwstatus;
			}
			event.setMessage(bytes);
			//std::cout << "command = " << std::hex << (int)event.data[0] << std::dec << std::endl;
			if (bytes[0] == 0xff && (bytes[1] == 1 ||
					bytes[1] == 2 || bytes[1] == 3 || bytes[1] == 4)) {
				// mididata.push_back('\0');
				// std::cout << '\t';
				// for (int m=0; m<event.data[2]; m++) {
				//    std::cout << event.data[m+3];
				// }
				// std::cout.flush();
			} else if (bytes[0] == 0xff && bytes[1] == 0x2f) {
				// end of track message
				// uncomment out the following three lines if you don't want
				// to see the end of track message (which is always required,
				// and added automatically when a MIDI is written.
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
				break;
			}

			if (bytes[0] != 0xff && bytes[0] != 0xf0) {
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
			} else {
				event.tick = absticks;
				event.track = i;
				m_events[i]->push_back(event);
			}

		}

	}

	m_theTimeState = TIME_STATE_ABSOLUTE;
	markSequence();
	return m_rwstatus;
}